

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::SimpleGraphicsPipelineBuilder::SimpleGraphicsPipelineBuilder
          (SimpleGraphicsPipelineBuilder *this,Context *context)

{
  VkPipelineShaderStageCreateInfo *local_58;
  Move<vk::Handle<(vk::HandleType)14>_> *local_30;
  Context *context_local;
  SimpleGraphicsPipelineBuilder_conflict *this_local;
  
  this->m_context = context;
  local_30 = this->m_shaderModules;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (Move<vk::Handle<(vk::HandleType)14>_> *)&this->m_shaderStageCount);
  local_58 = this->m_shaderStageInfo;
  do {
    ::vk::VkPipelineShaderStageCreateInfo::VkPipelineShaderStageCreateInfo(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != (VkPipelineShaderStageCreateInfo *)&this->m_patchControlPoints);
  this->m_patchControlPoints = 0;
  this->m_shaderStageCount = 0;
  return;
}

Assistant:

SimpleGraphicsPipelineBuilder::SimpleGraphicsPipelineBuilder (Context& context)
	: m_context(context)
{
	m_patchControlPoints = 0;
	m_shaderStageCount   = 0;
}